

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.c
# Opt level: O2

void http_on_request_handler______internal(http_s *h,http_settings_s *settings)

{
  int *piVar1;
  FIOBJ hash;
  int iVar2;
  FIOBJ FVar3;
  FIOBJ FVar4;
  uint64_t key_hash;
  fiobj_object_vtable_s *pfVar5;
  size_t sVar6;
  uintptr_t uVar7;
  fio_str_info_s val;
  
  if (http_upgrade_hash == 0) {
    http_upgrade_hash = fiobj_hash_string("upgrade",7);
  }
  h->udata = settings->udata;
  if (http_on_request_handler______internal::host_hash == 0) {
    http_on_request_handler______internal::host_hash = fiobj_hash_string("host",4);
  }
  FVar3 = fiobj_hash_get2(h->headers,http_on_request_handler______internal::host_hash);
  FVar4 = HTTP_HEADER_HOST;
  if (FVar3 == 0) {
    if (4 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http_internal.c:72): missing Host header"
                    );
    }
    http_send_error(h,400);
    return;
  }
  if (((~(uint)FVar3 & 6) != 0 && (FVar3 & 1) == 0) &&
     (*(char *)(FVar3 & 0xfffffffffffffff8) == ')')) {
    hash = h->headers;
    FVar3 = fiobj_ary_pop(FVar3);
    fiobj_hash_set(hash,FVar4,FVar3);
  }
  FVar4 = fiobj_hash_get2(h->headers,http_upgrade_hash);
  if (FVar4 == 0) {
    FVar4 = h->headers;
    key_hash = fiobj_obj2hash(HTTP_HEADER_ACCEPT);
    FVar3 = fiobj_hash_get2(FVar4,key_hash);
    FVar4 = HTTP_HVALUE_SSE_MIME;
    if (FVar3 == HTTP_HVALUE_SSE_MIME) {
LAB_00145612:
      (*settings->on_upgrade)(h,"sse",3);
      return;
    }
    if ((((HTTP_HVALUE_SSE_MIME != 0 && FVar3 != 0) && ((~(uint)HTTP_HVALUE_SSE_MIME & 6) != 0)) &&
        (((uint)FVar3 & 6) != 6)) &&
       (((((uint)HTTP_HVALUE_SSE_MIME | (uint)FVar3) & 1) == 0 &&
        (*(char *)(FVar3 & 0xfffffffffffffff8) ==
         *(char *)(HTTP_HVALUE_SSE_MIME & 0xfffffffffffffff8))))) {
      pfVar5 = fiobj_type_vtable(FVar3);
      sVar6 = (*pfVar5->is_eq)(FVar3,FVar4);
      if ((sVar6 != 0) &&
         (((pfVar5 = fiobj_type_vtable(FVar3),
           pfVar5->each == (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0 ||
           (uVar7 = (*pfVar5->count)(FVar3), uVar7 == 0)) ||
          (iVar2 = fiobj_iseq____internal_complex__(FVar3,FVar4), iVar2 != 0)))) goto LAB_00145612;
    }
    if (settings->public_folder != (char *)0x0) {
      fiobj_obj2cstr(&val,h->path);
      iVar2 = http_sendfile2(h,settings->public_folder,settings->public_folder_length,val.data,
                             val.len);
      if (iVar2 == 0) {
        return;
      }
    }
    (*settings->on_request)(h);
  }
  else {
    if ((~(uint)FVar4 & 6) != 0 && (FVar4 & 1) == 0) {
      LOCK();
      piVar1 = (int *)((FVar4 & 0xfffffffffffffff8) + 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    fiobj_obj2cstr(&val,FVar4);
    if ((*val.data == 'h') && (val.data[1] == '2')) {
      http_send_error(h,400);
    }
    else {
      (*settings->on_upgrade)(h,val.data,val.len);
    }
    fiobj_free(FVar4);
  }
  return;
}

Assistant:

void http_on_request_handler______internal(http_s *h,
                                           http_settings_s *settings) {
  if (!http_upgrade_hash)
    http_upgrade_hash = fiobj_hash_string("upgrade", 7);
  h->udata = settings->udata;

  static uint64_t host_hash = 0;
  if (!host_hash)
    host_hash = fiobj_hash_string("host", 4);

  if (1) {
    /* test for Host header and avoid duplicates */
    FIOBJ tmp = fiobj_hash_get2(h->headers, host_hash);
    if (!tmp)
      goto missing_host;
    if (FIOBJ_TYPE_IS(tmp, FIOBJ_T_ARRAY)) {
      fiobj_hash_set(h->headers, HTTP_HEADER_HOST, fiobj_ary_pop(tmp));
    }
  }

  FIOBJ t = fiobj_hash_get2(h->headers, http_upgrade_hash);
  if (t)
    goto upgrade;

  if (fiobj_iseq(
          fiobj_hash_get2(h->headers, fiobj_obj2hash(HTTP_HEADER_ACCEPT)),
          HTTP_HVALUE_SSE_MIME))
    goto eventsource;
  if (settings->public_folder) {
    fio_str_info_s path_str = fiobj_obj2cstr(h->path);
    if (!http_sendfile2(h, settings->public_folder,
                        settings->public_folder_length, path_str.data,
                        path_str.len)) {
      return;
    }
  }
  settings->on_request(h);
  return;

upgrade:
  if (1) {
    fiobj_dup(t); /* allow upgrade name access after http_finish */
    fio_str_info_s val = fiobj_obj2cstr(t);
    if (val.data[0] == 'h' && val.data[1] == '2') {
      http_send_error(h, 400);
    } else {
      settings->on_upgrade(h, val.data, val.len);
    }
    fiobj_free(t);
    return;
  }
eventsource:
  settings->on_upgrade(h, (char *)"sse", 3);
  return;
missing_host:
  FIO_LOG_DEBUG("missing Host header");
  http_send_error(h, 400);
  return;
}